

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.h
# Opt level: O2

void __thiscall crnlib::dxt5_block::flip_y(dxt5_block *this,uint w,uint h)

{
  uint val;
  uint val_00;
  uint x;
  uint x_00;
  uint y;
  uint y_00;
  
  for (y_00 = 0; y_00 != h >> 1; y_00 = y_00 + 1) {
    for (x_00 = 0; w != x_00; x_00 = x_00 + 1) {
      val = get_selector(this,x_00,y_00);
      val_00 = get_selector(this,x_00,~y_00 + h);
      set_selector(this,x_00,y_00,val_00);
      set_selector(this,x_00,~y_00 + h,val);
    }
  }
  return;
}

Assistant:

inline void flip_y(uint w = 4, uint h = 4)
        {
            for (uint y = 0; y < (h / 2); y++)
            {
                for (uint x = 0; x < w; x++)
                {
                    const uint c = get_selector(x, y);
                    set_selector(x, y, get_selector(x, (h - 1) - y));
                    set_selector(x, (h - 1) - y, c);
                }
            }
        }